

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opal.c
# Opt level: O0

void OpalOperator_SetKeyOn(OpalOperator *self,opal_bool on)

{
  opal_bool on_local;
  OpalOperator *self_local;
  
  if (self->KeyOn != on) {
    self->KeyOn = on;
    if (on == 0) {
      if ((self->EnvelopeStage != -1) && (self->EnvelopeStage != 3)) {
        self->EnvelopeStage = 3;
      }
    }
    else {
      if (self->AttackRate == 0xf) {
        self->EnvelopeStage = 1;
        self->EnvelopeLevel = 0;
      }
      else {
        self->EnvelopeStage = 0;
      }
      self->Phase = 0;
    }
  }
  return;
}

Assistant:

void OpalOperator_SetKeyOn(OpalOperator* self, opal_bool on)
{
    /* Already on/off? */
    if(self->KeyOn == on)
        return;

    self->KeyOn = on;

    if(on)
    {
        /* The highest attack rate is instant; it bypasses the attack phase */
        if(self->AttackRate == 15)
        {
            self->EnvelopeStage = OpalEnvDec;
            self->EnvelopeLevel = 0;
        }
        else
            self->EnvelopeStage = OpalEnvAtt;

        self->Phase = 0;

    }
    else
    {
        /* Stopping current sound? */
        if(self->EnvelopeStage != OpalEnvOff && self->EnvelopeStage != OpalEnvRel)
            self->EnvelopeStage = OpalEnvRel;
    }
}